

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::TransferList(InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  char *pcVar2;
  Node *node;
  char cVar3;
  long lVar4;
  iterator local_30;
  
  node = (Node *)table[index];
  do {
    pcVar2 = (node->kv).k_._M_dataplus._M_p;
    cVar3 = *pcVar2;
    if (cVar3 == '\0') {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        pcVar2 = pcVar2 + 1;
        lVar4 = (long)cVar3 + lVar4 * 5;
        cVar3 = *pcVar2;
      } while (cVar3 != '\0');
    }
    pNVar1 = node->next;
    InsertUnique(&local_30,this,this->num_buckets_ - 1 & (this->seed_ | 1) * lVar4,node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != NULL);
    }